

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

int Wln_ObjDup(Wln_Ntk_t *pNew,Wln_Ntk_t *p,int iObj)

{
  int iObj_00;
  int iVar1;
  int iObjNew;
  int iFanin;
  int i;
  int iObj_local;
  Wln_Ntk_t *p_local;
  Wln_Ntk_t *pNew_local;
  
  iObj_00 = Wln_ObjClone(pNew,p,iObj);
  for (iObjNew = 0; iVar1 = Wln_ObjFaninNum(p,iObj), iObjNew < iVar1; iObjNew = iObjNew + 1) {
    iVar1 = Wln_ObjFanin(p,iObj,iObjNew);
    if (iVar1 != 0) {
      iVar1 = Wln_ObjCopy(p,iVar1);
      Wln_ObjAddFanin(pNew,iObj_00,iVar1);
    }
  }
  iVar1 = Wln_ObjIsConst(p,iObj);
  if (iVar1 == 0) {
    iVar1 = Wln_ObjIsSlice(p,iObj);
    if (((iVar1 != 0) || (iVar1 = Wln_ObjIsRotate(p,iObj), iVar1 != 0)) ||
       (iVar1 = Wln_ObjIsTable(p,iObj), iVar1 != 0)) {
      iVar1 = Wln_ObjFanin1(p,iObj);
      Wln_ObjSetFanin(pNew,iObj_00,1,iVar1);
    }
  }
  else {
    iVar1 = Wln_ObjFanin0(p,iObj);
    Wln_ObjSetConst(pNew,iObj_00,iVar1);
  }
  Wln_ObjSetCopy(p,iObj,iObj_00);
  return iObj_00;
}

Assistant:

int Wln_ObjDup( Wln_Ntk_t * pNew, Wln_Ntk_t * p, int iObj )
{
    int i, iFanin, iObjNew = Wln_ObjClone( pNew, p, iObj );
    Wln_ObjForEachFanin( p, iObj, iFanin, i )
        Wln_ObjAddFanin( pNew, iObjNew, Wln_ObjCopy(p, iFanin) );
    if ( Wln_ObjIsConst(p, iObj) )
        Wln_ObjSetConst( pNew, iObjNew, Wln_ObjFanin0(p, iObj) );
    else if ( Wln_ObjIsSlice(p, iObj) || Wln_ObjIsRotate(p, iObj) || Wln_ObjIsTable(p, iObj) )
        Wln_ObjSetFanin( pNew, iObjNew, 1, Wln_ObjFanin1(p, iObj) );
    Wln_ObjSetCopy( p, iObj, iObjNew );
    return iObjNew;
}